

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int r4k_map_address_mips64el
              (CPUMIPSState_conflict5 *env,hwaddr *physical,int *prot,target_ulong address,int rw,
              int access_type)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (((uint)env->CP0_Config5 >> 0x11 & 1) == 0) {
    uVar3 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  }
  else {
    uVar3 = env->CP0_MemoryMapID;
  }
  uVar7 = (ulong)env->tlb->tlb_in_use;
  puVar4 = (undefined1 *)((long)&env->tlb->mmu + 0x18);
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) {
      return -2;
    }
    if (((uint)env->CP0_Config5 >> 0x11 & 1) == 0) {
      uVar2 = (uint)*(ushort *)(puVar4 + -0xc);
    }
    else {
      uVar2 = *(uint *)(puVar4 + -8);
    }
    uVar1 = *(ushort *)(puVar4 + -4);
    if (((((uVar1 & 1) != 0) || (uVar2 == uVar3)) &&
        (uVar6 = (ulong)*(uint *)(puVar4 + -0x10) | 0x1fff,
        ((env->SEGMask & address ^
         (((anon_union_5120_1_ba1d6e09_for_mmu *)(puVar4 + -0x18))->r4k).tlb[0].VPN) & ~uVar6) == 0)
        ) && (-1 < (short)uVar1)) break;
    puVar4 = puVar4 + 0x28;
  }
  uVar5 = (uint)uVar6;
  uVar3 = (uint)(uVar6 >> 1);
  uVar2 = ~uVar3 & (uint)address;
  if ((uVar2 & uVar5) == 0) {
    if (-1 < (char)uVar1) {
      return -3;
    }
  }
  else if ((uVar1 >> 8 & 1) == 0) {
    return -3;
  }
  if (rw == 0) {
    if ((uVar2 & uVar5) == 0) {
      if ((uVar1 >> 0xd & 1) != 0) {
        return -5;
      }
    }
    else if (0x3fff < uVar1) {
      return -5;
    }
  }
  else if (rw == 1) {
    if ((uVar2 & uVar5) == 0) {
      uVar1 = uVar1 >> 9;
    }
    else {
      uVar1 = uVar1 >> 10;
    }
    if ((uVar1 & 1) == 0) {
      return -4;
    }
  }
  else if (rw == 2) {
    if ((uVar2 & uVar5) == 0) {
      uVar1 = uVar1 >> 0xb;
    }
    else {
      uVar1 = uVar1 >> 0xc;
    }
    if ((uVar1 & 1) != 0) {
      return -6;
    }
  }
  *physical = (ulong)(uVar3 & (uint)address) |
              *(ulong *)(puVar4 + (ulong)((uVar2 & uVar5) != 0) * 8);
  *prot = 1;
  uVar1 = *(ushort *)(puVar4 + -4);
  uVar3 = (uint)uVar1;
  if ((uVar2 & uVar5) == 0) {
    if ((uVar1 >> 9 & 1) == 0) {
      uVar2 = 1;
    }
    else {
      *prot = 3;
      uVar3 = (uint)*(ushort *)(puVar4 + -4);
      uVar2 = 3;
    }
    uVar3 = uVar3 >> 0xb;
  }
  else {
    if ((uVar1 >> 10 & 1) == 0) {
      uVar2 = 1;
    }
    else {
      *prot = 3;
      uVar3 = (uint)*(ushort *)(puVar4 + -4);
      uVar2 = 3;
    }
    uVar3 = uVar3 >> 0xc;
  }
  if ((uVar3 & 1) == 0) {
    *prot = uVar2 | 4;
  }
  return 0;
}

Assistant:

int r4k_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                    target_ulong address, int rw, int access_type)
{
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;

    for (i = 0; i < env->tlb->tlb_in_use; i++) {
        r4k_tlb_t *tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        target_ulong mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        target_ulong tag = address & ~mask;
        target_ulong VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif

        /* Check ASID/MMID, virtual page number & size */
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            int n = !!(address & mask & ~(mask >> 1));
            /* Check access rights */
            if (!(n ? tlb->V1 : tlb->V0)) {
                return TLBRET_INVALID;
            }
            if (rw == MMU_INST_FETCH && (n ? tlb->XI1 : tlb->XI0)) {
                return TLBRET_XI;
            }
            if (rw == MMU_DATA_LOAD && (n ? tlb->RI1 : tlb->RI0)) {
                return TLBRET_RI;
            }
            if (rw != MMU_DATA_STORE || (n ? tlb->D1 : tlb->D0)) {
                *physical = tlb->PFN[n] | (address & (mask >> 1));
                *prot = PAGE_READ;
                if (n ? tlb->D1 : tlb->D0) {
                    *prot |= PAGE_WRITE;
                }
                if (!(n ? tlb->XI1 : tlb->XI0)) {
                    *prot |= PAGE_EXEC;
                }
                return TLBRET_MATCH;
            }
            return TLBRET_DIRTY;
        }
    }
    return TLBRET_NOMATCH;
}